

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Multiband.cpp
# Opt level: O0

int Multiband::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  ulong uVar1;
  UnityAudioParameterDefinition *pUVar2;
  char *pcVar3;
  char *pcVar4;
  int local_2c;
  int local_28;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int numparams;
  UnityAudioEffectDefinition *definition_local;
  
  uVar1 = SUB168(ZEXT816(0x19) * ZEXT816(0x40),0);
  if (SUB168(ZEXT816(0x19) * ZEXT816(0x40),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  pUVar2 = (UnityAudioParameterDefinition *)operator_new__(uVar1);
  definition->paramdefs = pUVar2;
  RegisterParameter(definition,"MasterGain","dB",-100.0,100.0,0.0,1.0,1.0,0,"Overall gain");
  RegisterParameter(definition,"LowFreq","Hz",0.01,24000.0,800.0,1.0,3.0,1,
                    "Low/Mid cross-over frequency");
  RegisterParameter(definition,"HighFreq","Hz",0.01,24000.0,5000.0,1.0,3.0,2,
                    "Mid/High cross-over frequency");
  for (i_2 = 0; i_2 < 3; i_2 = i_2 + 1) {
    pcVar3 = tmpstr(0,"%sGain",InternalRegisterEffectDefinition::bandname[i_2]);
    pcVar4 = tmpstr(1,"%s band gain in dB",InternalRegisterEffectDefinition::bandname[i_2]);
    RegisterParameter(definition,pcVar3,"dB",-100.0,100.0,0.0,1.0,1.0,i_2 + 3,pcVar4);
  }
  for (i_3 = 0; i_3 < 3; i_3 = i_3 + 1) {
    pcVar3 = tmpstr(0,"%sAttackTime",InternalRegisterEffectDefinition::bandname[i_3]);
    pcVar4 = tmpstr(1,"%s band attack time in seconds",
                    InternalRegisterEffectDefinition::bandname[i_3]);
    RegisterParameter(definition,pcVar3,"ms",0.0,10.0,0.1,1000.0,4.0,i_3 + 6,pcVar4);
  }
  for (i_4 = 0; i_4 < 3; i_4 = i_4 + 1) {
    pcVar3 = tmpstr(0,"%sReleaseTime",InternalRegisterEffectDefinition::bandname[i_4]);
    pcVar4 = tmpstr(1,"%s band release time in seconds",
                    InternalRegisterEffectDefinition::bandname[i_4]);
    RegisterParameter(definition,pcVar3,"ms",0.0,10.0,0.5,1000.0,4.0,i_4 + 9,pcVar4);
  }
  for (i_5 = 0; i_5 < 3; i_5 = i_5 + 1) {
    pcVar3 = tmpstr(0,"%sThreshold",InternalRegisterEffectDefinition::bandname[i_5]);
    pcVar4 = tmpstr(1,"%s band compression level threshold time in dB",
                    InternalRegisterEffectDefinition::bandname[i_5]);
    RegisterParameter(definition,pcVar3,"dB",-50.0,0.0,-10.0,1.0,1.0,i_5 + 0xc,pcVar4);
  }
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    pcVar3 = tmpstr(0,"%sRatio",InternalRegisterEffectDefinition::bandname[local_28]);
    pcVar4 = tmpstr(1,"%s band compression ratio time in percent",
                    InternalRegisterEffectDefinition::bandname[local_28]);
    RegisterParameter(definition,pcVar3,"%",1.0,30.0,1.0,100.0,1.0,local_28 + 0xf,pcVar4);
  }
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    pcVar3 = tmpstr(0,"%sKnee",InternalRegisterEffectDefinition::bandname[local_2c]);
    pcVar4 = tmpstr(1,"%s band compression curve knee range in dB",
                    InternalRegisterEffectDefinition::bandname[local_2c]);
    RegisterParameter(definition,pcVar3,"dB",0.0,40.0,10.0,1.0,1.0,local_2c + 0x12,pcVar4);
  }
  RegisterParameter(definition,"FilterOrder","",1.0,4.0,1.0,1.0,1.0,0x15,
                    "Filter order of cross-over filters");
  RegisterParameter(definition,"UseLogScale","",0.0,1.0,1.0,1.0,1.0,0x16,
                    "Use logarithmic scale for plotting the filter curve frequency response and input/output spectra"
                   );
  RegisterParameter(definition,"ShowSpectrum","",0.0,1.0,0.0,1.0,1.0,0x17,
                    "Overlay input spectrum (green) and output spectrum (red)");
  RegisterParameter(definition,"SpectrumDecay","dB/s",-50.0,0.0,-10.0,1.0,1.0,0x18,
                    "Hold time for overlaid spectra");
  return 0x19;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        static const char* bandname[] = { "Low", "Mid", "High" };
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "MasterGain", "dB", -100.0f, 100.0f, 0.0f, 1.0f, 1.0f, P_MasterGain, "Overall gain");
        RegisterParameter(definition, "LowFreq", "Hz", 0.01f, 24000.0f, 800.0f, 1.0f, 3.0f, P_LowFreq, "Low/Mid cross-over frequency");
        RegisterParameter(definition, "HighFreq", "Hz", 0.01f, 24000.0f, 5000.0f, 1.0f, 3.0f, P_HighFreq, "Mid/High cross-over frequency");
        for (int i = 0; i < 3; i++)
            RegisterParameter(definition, tmpstr(0, "%sGain", bandname[i]), "dB", -100.0f, 100.0f, 0.0f, 1.0f, 1.0f, P_LowGain + i, tmpstr(1, "%s band gain in dB", bandname[i]));
        for (int i = 0; i < 3; i++)
            RegisterParameter(definition, tmpstr(0, "%sAttackTime", bandname[i]), "ms", 0.0f, 10.0f, 0.1f, 1000.0f, 4.0f, P_LowAttack + i, tmpstr(1, "%s band attack time in seconds", bandname[i]));
        for (int i = 0; i < 3; i++)
            RegisterParameter(definition, tmpstr(0, "%sReleaseTime", bandname[i]), "ms", 0.0f, 10.0f, 0.5f, 1000.0f, 4.0f, P_LowRelease + i, tmpstr(1, "%s band release time in seconds", bandname[i]));
        for (int i = 0; i < 3; i++)
            RegisterParameter(definition, tmpstr(0, "%sThreshold", bandname[i]), "dB", -50.0f, 0.0f, -10.0f, 1.0f, 1.0f, P_LowThreshold + i, tmpstr(1, "%s band compression level threshold time in dB", bandname[i]));
        for (int i = 0; i < 3; i++)
            RegisterParameter(definition, tmpstr(0, "%sRatio", bandname[i]), "%", 1.0f, 30.0f, 1.0f, 100.0f, 1.0f, P_LowRatio + i, tmpstr(1, "%s band compression ratio time in percent", bandname[i]));
        for (int i = 0; i < 3; i++)
            RegisterParameter(definition, tmpstr(0, "%sKnee", bandname[i]), "dB", 0.0f, 40.0f, 10.0f, 1.0f, 1.0f, P_LowKnee + i, tmpstr(1, "%s band compression curve knee range in dB", bandname[i]));
        RegisterParameter(definition, "FilterOrder", "", 1.0f, (float)MAXORDER, 1.0f, 1.0f, 1.0f, P_FilterOrder, "Filter order of cross-over filters");
        RegisterParameter(definition, "UseLogScale", "", 0.0f, 1.0f, 1.0f, 1.0f, 1.0f, P_UseLogScale, "Use logarithmic scale for plotting the filter curve frequency response and input/output spectra");
        RegisterParameter(definition, "ShowSpectrum", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_ShowSpectrum, "Overlay input spectrum (green) and output spectrum (red)");
        RegisterParameter(definition, "SpectrumDecay", "dB/s", -50.0f, 0.0f, -10.0f, 1.0f, 1.0f, P_SpectrumDecay, "Hold time for overlaid spectra");
        return numparams;
    }